

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_levels_dec_utils.c
# Opt level: O3

int WebPDequantizeLevels(uint8_t *data,int width,int height,int stride,int strength)

{
  undefined2 *puVar1;
  void *pvVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  size_t __n;
  short sVar7;
  uint uVar8;
  void *ptr;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  short *psVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint16_t *top;
  void *__s;
  int iVar17;
  uint uVar18;
  uint8_t *puVar19;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  short sVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  uint16_t *cur;
  long lVar32;
  uint8_t *src;
  short *psVar33;
  uint16_t *out;
  int w;
  uint8_t used_levels [256];
  int local_1f4;
  uint8_t *local_1d0;
  char local_138 [264];
  
  iVar15 = 0;
  if (((uint)strength < 0x65) &&
     (uVar5 = (ulong)(uint)width, iVar15 = 0, (0 < height && 0 < width) && data != (uint8_t *)0x0))
  {
    uVar8 = width - 1U >> 1;
    if ((strength / 0x19) * 2 < width) {
      uVar8 = strength / 0x19;
    }
    uVar6 = height - 1U >> 1;
    if ((int)(uVar8 * 2) < height) {
      uVar6 = uVar8;
    }
    if (0 < (int)uVar6) {
      uVar10 = (ulong)((uVar6 * 2 + 2) * width * 2);
      ptr = WebPSafeMalloc(1,uVar10 + uVar5 * 2 + 0xffe);
      if (ptr == (void *)0x0) {
        return 0;
      }
      local_1f4 = -uVar6;
      __n = uVar5 * 2;
      uVar31 = uVar6 * 2 | 1;
      pvVar2 = (void *)((long)ptr + (ulong)(uVar31 * width) * 2);
      __s = (void *)((long)pvVar2 + uVar5 * -2);
      uVar16 = 0;
      memset(__s,0,__n);
      memset(local_138,0,0x100);
      lVar32 = (long)stride;
      uVar22 = 0xff;
      uVar18 = 0;
      uVar8 = 0xff;
      iVar15 = 0;
      puVar19 = data;
      do {
        uVar24 = 0;
        uVar25 = uVar18;
        uVar28 = uVar8;
        do {
          bVar4 = puVar19[uVar24];
          if (bVar4 < uVar28) {
            uVar8 = (uint)bVar4;
            uVar22 = (ulong)bVar4;
          }
          if (bVar4 <= uVar28) {
            uVar28 = (uint)bVar4;
          }
          uVar30 = (uint)bVar4;
          if (uVar25 < uVar30) {
            uVar18 = uVar30;
            uVar16 = uVar30;
          }
          if (uVar25 <= uVar30) {
            uVar25 = uVar30;
          }
          local_138[bVar4] = '\x01';
          uVar24 = uVar24 + 1;
        } while (uVar5 != uVar24);
        puVar19 = puVar19 + lVar32;
        iVar15 = iVar15 + 1;
      } while (iVar15 != height);
      iVar15 = uVar18 - uVar8;
      iVar9 = -1;
      iVar17 = 0;
      lVar11 = 0;
      do {
        iVar29 = iVar9;
        if (local_138[lVar11] != '\0') {
          iVar17 = iVar17 + 1;
          iVar29 = (int)lVar11;
          if ((-1 < iVar9) && (iVar29 - iVar9 < iVar15)) {
            iVar15 = iVar29 - iVar9;
          }
        }
        iVar9 = iVar29;
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x100);
      puVar1 = (undefined2 *)((long)ptr + __n + uVar10 + 0x7fe);
      iVar29 = iVar15 * 0xc >> 2;
      psVar33 = (short *)((long)ptr + __n + uVar10 + 0x7fc);
      iVar9 = (iVar15 * 4 + -1) * iVar29;
      lVar11 = 0;
      do {
        lVar26 = lVar11 + 1;
        if (iVar29 < lVar26) {
          uVar8 = 0;
          if (lVar26 < iVar15 * 4) {
            uVar8 = iVar9 / (iVar15 * 4 - iVar29);
          }
        }
        else {
          uVar8 = (uint)lVar26;
        }
        sVar7 = (short)(uVar8 >> 2);
        *(short *)((long)ptr + lVar11 * 2 + __n + uVar10 + 0x800) = sVar7;
        *psVar33 = -sVar7;
        psVar33 = psVar33 + -1;
        iVar9 = iVar9 - iVar29;
        lVar11 = lVar26;
      } while (lVar26 != 0x3ff);
      uVar8 = 0x40000 / (uVar31 * uVar31);
      *puVar1 = 0;
      if ((2 < iVar17) && (local_1f4 < height)) {
        uVar18 = uVar6 + 1;
        lVar26 = (long)(int)uVar18;
        uVar24 = (ulong)((uVar6 * 2 + 1) * width);
        lVar11 = uVar24 * 2 + (ulong)uVar6 * 2;
        psVar33 = (short *)((long)ptr + lVar11);
        pvVar20 = ptr;
        local_1d0 = data;
        do {
          uVar12 = 0;
          sVar7 = 0;
          do {
            sVar7 = sVar7 + (ushort)data[uVar12];
            sVar23 = *(short *)((long)__s + uVar12 * 2) + sVar7;
            *(short *)((long)ptr + uVar12 * 2 + uVar24 * 2) =
                 sVar23 - *(short *)((long)pvVar20 + uVar12 * 2);
            *(short *)((long)pvVar20 + uVar12 * 2) = sVar23;
            uVar12 = uVar12 + 1;
          } while (uVar5 != uVar12);
          pvVar21 = (void *)(uVar5 * 2 + (long)pvVar20);
          if (pvVar21 == pvVar2) {
            pvVar21 = ptr;
          }
          lVar27 = 0;
          if (local_1f4 < (int)(height - 1U)) {
            lVar27 = lVar32;
          }
          if (local_1f4 < 0) {
            lVar27 = 0;
          }
          if ((int)uVar6 <= local_1f4) {
            uVar12 = 0;
            psVar13 = psVar33;
            do {
              *(short *)((long)ptr + uVar12 * 2 + uVar10) =
                   (short)((ushort)(*psVar13 + psVar33[uVar12 - 1]) * uVar8 >> 0x10);
              uVar12 = uVar12 + 1;
              psVar13 = psVar13 + -1;
            } while (uVar18 != uVar12);
            uVar31 = uVar18;
            if ((int)uVar18 < (int)(width - uVar6)) {
              lVar14 = 0;
              do {
                *(short *)((long)ptr + lVar14 * 2 + uVar10 + lVar26 * 2) =
                     (short)((ushort)(*(short *)((long)ptr + lVar14 * 2 + lVar11 + lVar26 * 2) -
                                     *(short *)((long)pvVar2 + (long)(int)lVar14 * 2)) * uVar8 >>
                            0x10);
                lVar3 = lVar26 + lVar14;
                lVar14 = lVar14 + 1;
              } while (lVar3 + 1 < (long)(int)(width - uVar6));
              uVar31 = (int)lVar14 + uVar18;
            }
            if ((int)uVar31 < width) {
              iVar15 = (width * 2 + -2) - (uVar6 + uVar31);
              lVar14 = 0;
              do {
                *(short *)((long)ptr + lVar14 * 2 + (long)(int)uVar31 * 2 + uVar10) =
                     (short)(((uint)*(ushort *)((long)pvVar2 + uVar5 * 2 + -2) * 2 -
                              (uint)(ushort)(*(short *)((long)pvVar2 + (long)iVar15 * 2) +
                                            *(short *)((long)pvVar2 +
                                                      (long)(int)(uVar31 + ~uVar6 + (int)lVar14) * 2
                                                      )) & 0xffff) * uVar8 >> 0x10);
                lVar14 = lVar14 + 1;
                iVar15 = iVar15 + -1;
              } while (uVar5 - (long)(int)uVar31 != lVar14);
            }
            uVar12 = 0;
            do {
              bVar4 = local_1d0[uVar12];
              if ((bVar4 < uVar16) && ((uint)uVar22 < (uint)bVar4)) {
                iVar15 = (int)(short)puVar1[(ulong)*(ushort *)((long)ptr + uVar12 * 2 + uVar10) -
                                            (ulong)((uint)bVar4 * 4)] + (uint)bVar4;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                if (0xfe < iVar15) {
                  iVar15 = 0xff;
                }
                local_1d0[uVar12] = (uint8_t)iVar15;
              }
              uVar12 = uVar12 + 1;
            } while (uVar5 != uVar12);
            local_1d0 = local_1d0 + lVar32;
          }
          data = data + lVar27;
          local_1f4 = local_1f4 + 1;
          __s = pvVar20;
          pvVar20 = pvVar21;
        } while (local_1f4 != height);
      }
      WebPSafeFree(ptr);
    }
    iVar15 = 1;
  }
  return iVar15;
}

Assistant:

int WebPDequantizeLevels(uint8_t* const data, int width, int height, int stride,
                         int strength) {
  int radius = 4 * strength / 100;

  if (strength < 0 || strength > 100) return 0;
  if (data == NULL || width <= 0 || height <= 0) return 0;  // bad params

  // limit the filter size to not exceed the image dimensions
  if (2 * radius + 1 > width) radius = (width - 1) >> 1;
  if (2 * radius + 1 > height) radius = (height - 1) >> 1;

  if (radius > 0) {
    SmoothParams p;
    memset(&p, 0, sizeof(p));
    if (!InitParams(data, width, height, stride, radius, &p)) return 0;
    if (p.num_levels_ > 2) {
      for (; p.row_ < p.height_; ++p.row_) {
        VFilter(&p);  // accumulate average of input
        // Need to wait few rows in order to prime the filter,
        // before emitting some output.
        if (p.row_ >= p.radius_) {
          HFilter(&p);
          ApplyFilter(&p);
        }
      }
    }
    CleanupParams(&p);
  }
  return 1;
}